

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.cpp
# Opt level: O3

void __thiscall embree::BVHNStatistics<4>::BVHNStatistics(BVHNStatistics<4> *this,BVH *bvh)

{
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes;
  long lVar1;
  LeafStat *pLVar2;
  double *pdVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  LeafStat in_stack_fffffffffffffca8;
  LeafStat local_1a0;
  Statistics local_130;
  
  bVar4 = 0;
  this->bvh = bvh;
  Statistics::LeafStat::LeafStat(&local_1a0,0.0,0,0,0,0,0);
  pLVar2 = &local_1a0;
  pdVar3 = (double *)&stack0xfffffffffffffca8;
  for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar3 = pLVar2->leafSAH;
    pLVar2 = (LeafStat *)((long)pLVar2 + (ulong)bVar4 * -0x10 + 8);
    pdVar3 = pdVar3 + (ulong)bVar4 * -2 + 1;
  }
  statAABBNodes.numChildren = 0;
  statAABBNodes.nodeSAH = 0.0;
  statAABBNodes.numNodes = 0;
  statOBBNodes.numChildren = 0;
  statOBBNodes.nodeSAH = 0.0;
  statOBBNodes.numNodes = 0;
  statAABBNodesMB.numChildren = 0;
  statAABBNodesMB.nodeSAH = 0.0;
  statAABBNodesMB.numNodes = 0;
  statAABBNodesMB4D.numChildren = 0;
  statAABBNodesMB4D.nodeSAH = 0.0;
  statAABBNodesMB4D.numNodes = 0;
  statOBBNodesMB.numChildren = 0;
  statOBBNodesMB.nodeSAH = 0.0;
  statOBBNodesMB.numNodes = 0;
  statQuantizedNodes.numChildren = 0;
  statQuantizedNodes.nodeSAH = 0.0;
  statQuantizedNodes.numNodes = 0;
  Statistics::Statistics
            (&this->stat,0,in_stack_fffffffffffffca8,statAABBNodes,statOBBNodes,statAABBNodesMB,
             statAABBNodesMB4D,statOBBNodesMB,statQuantizedNodes);
  fVar8 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[0];
  fVar9 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[1] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[1];
  fVar10 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[2] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[2];
  fVar5 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[0];
  fVar6 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[1] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[1];
  fVar7 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[2] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[2];
  fVar11 = fVar5 - fVar8;
  fVar12 = fVar6 - fVar9;
  fVar13 = fVar7 - fVar10;
  fVar6 = fVar6 - fVar9;
  fVar7 = fVar7 - fVar10;
  fVar5 = fVar5 - fVar8;
  fVar5 = fVar5 * fVar13 * 0.33333334 + (fVar8 * fVar13 + fVar10 * fVar5) * 0.5 + fVar10 * fVar8 +
          fVar7 * fVar12 * 0.33333334 + (fVar10 * fVar12 + fVar9 * fVar7) * 0.5 + fVar9 * fVar10 +
          fVar6 * fVar11 * 0.33333334 + (fVar9 * fVar11 + fVar8 * fVar6) * 0.5 + fVar8 * fVar9;
  if (fVar5 <= 0.0) {
    fVar5 = 0.0;
  }
  statistics(&local_130,this,(NodeRef)(bvh->root).ptr,(double)fVar5,(BBox1f)0x3f80000000000000);
  memcpy(&this->stat,&local_130,0x108);
  return;
}

Assistant:

BVHNStatistics<N>::BVHNStatistics (BVH* bvh) : bvh(bvh)
  {
    double A = max(0.0f,bvh->getLinearBounds().expectedHalfArea());
    stat = statistics(bvh->root,A,BBox1f(0.0f,1.0f));
  }